

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

SparseBufferProperties __thiscall Diligent::BufferGLImpl::GetSparseProperties(BufferGLImpl *this)

{
  Char *Message;
  SparseBufferProperties SVar1;
  undefined1 local_40 [8];
  string msg;
  BufferGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  FormatString<char[58]>
            ((string *)local_40,
             (char (*) [58])"IBuffer::GetSparseProperties() is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"GetSparseProperties",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
             ,0x1b1);
  std::__cxx11::string::~string((string *)local_40);
  SVar1._12_4_ = 0;
  SVar1.AddressSpaceSize = 0;
  SVar1.BlockSize = 0;
  return SVar1;
}

Assistant:

SparseBufferProperties BufferGLImpl::GetSparseProperties() const
{
    DEV_ERROR("IBuffer::GetSparseProperties() is not supported in OpenGL");
    return {};
}